

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

void Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ReserveResourceLayout
               (PipelineResourceLayoutDesc *SrcLayout,FixedLinearAllocator *MemPool)

{
  Char *pCVar1;
  undefined1 local_68 [8];
  string msg_1;
  undefined1 local_40 [4];
  Uint32 i_1;
  string msg;
  Uint32 i;
  FixedLinearAllocator *MemPool_local;
  PipelineResourceLayoutDesc *SrcLayout_local;
  
  if (SrcLayout->Variables != (ShaderResourceVariableDesc *)0x0) {
    FixedLinearAllocator::AddSpace<Diligent::ShaderResourceVariableDesc>
              (MemPool,(ulong)SrcLayout->NumVariables);
    for (msg.field_2._12_4_ = 0; (uint)msg.field_2._12_4_ < SrcLayout->NumVariables;
        msg.field_2._12_4_ = msg.field_2._12_4_ + 1) {
      if (SrcLayout->Variables[(uint)msg.field_2._12_4_].Name == (Char *)0x0) {
        FormatString<char[28]>((string *)local_40,(char (*) [28])"Variable name can\'t be null");
        pCVar1 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar1,"ReserveResourceLayout",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                   ,0x49b);
        std::__cxx11::string::~string((string *)local_40);
      }
      FixedLinearAllocator::AddSpaceForString
                (MemPool,SrcLayout->Variables[(uint)msg.field_2._12_4_].Name,0);
    }
  }
  if (SrcLayout->ImmutableSamplers != (ImmutableSamplerDesc *)0x0) {
    FixedLinearAllocator::AddSpace<Diligent::ImmutableSamplerDesc>
              (MemPool,(ulong)SrcLayout->NumImmutableSamplers);
    for (msg_1.field_2._12_4_ = 0; (uint)msg_1.field_2._12_4_ < SrcLayout->NumImmutableSamplers;
        msg_1.field_2._12_4_ = msg_1.field_2._12_4_ + 1) {
      if (SrcLayout->ImmutableSamplers[(uint)msg_1.field_2._12_4_].SamplerOrTextureName ==
          (Char *)0x0) {
        FormatString<char[48]>
                  ((string *)local_68,
                   (char (*) [48])"Immutable sampler or texture name can\'t be null");
        pCVar1 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar1,"ReserveResourceLayout",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                   ,0x4a5);
        std::__cxx11::string::~string((string *)local_68);
      }
      FixedLinearAllocator::AddSpaceForString
                (MemPool,SrcLayout->ImmutableSamplers[(uint)msg_1.field_2._12_4_].
                         SamplerOrTextureName,0);
    }
  }
  return;
}

Assistant:

static void ReserveResourceLayout(const PipelineResourceLayoutDesc& SrcLayout, FixedLinearAllocator& MemPool) noexcept
    {
        if (SrcLayout.Variables != nullptr)
        {
            MemPool.AddSpace<ShaderResourceVariableDesc>(SrcLayout.NumVariables);
            for (Uint32 i = 0; i < SrcLayout.NumVariables; ++i)
            {
                VERIFY(SrcLayout.Variables[i].Name != nullptr, "Variable name can't be null");
                MemPool.AddSpaceForString(SrcLayout.Variables[i].Name);
            }
        }

        if (SrcLayout.ImmutableSamplers != nullptr)
        {
            MemPool.AddSpace<ImmutableSamplerDesc>(SrcLayout.NumImmutableSamplers);
            for (Uint32 i = 0; i < SrcLayout.NumImmutableSamplers; ++i)
            {
                VERIFY(SrcLayout.ImmutableSamplers[i].SamplerOrTextureName != nullptr, "Immutable sampler or texture name can't be null");
                MemPool.AddSpaceForString(SrcLayout.ImmutableSamplers[i].SamplerOrTextureName);
            }
        }

        static_assert(std::is_trivially_destructible<decltype(*SrcLayout.Variables)>::value, "Add destructor for this object to Destruct()");
        static_assert(std::is_trivially_destructible<decltype(*SrcLayout.ImmutableSamplers)>::value, "Add destructor for this object to Destruct()");
    }